

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  DOMNode *pDVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  DOMDocument *document;
  undefined8 uVar22;
  long *plVar23;
  long *plVar24;
  long lVar25;
  XercesDOMParser *this;
  int iVar26;
  XMLCh *pXVar27;
  DOMTest *pDVar28;
  DOMTest *this_00;
  XercesDOMParser *pXVar29;
  DOMTest test;
  char *pMessage;
  DOMTest local_41;
  DOMNode *local_40;
  
  pDVar28 = (DOMTest *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  document = DOMTest::createDocument(pDVar28);
  xercesc_4_0::XMLString::transcode
            ("testDocument1",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar22 = (**(code **)(*(long *)document + 0x118))(document,tempStr);
  pDVar1 = (DOMNode *)(document + 0x18);
  (**(code **)(*(long *)(document + 0x18) + 0x88))(pDVar1,uVar22);
  xercesc_4_0::XMLString::transcode
            ("ourEntityNode",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)document + 0x110))(document,tempStr);
  pDVar28 = (DOMTest *)0x1212a5;
  xercesc_4_0::XMLString::transcode
            ("d",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = DOMTest::docBuilder(pDVar28,document,tempStr3);
  local_40 = pDVar1;
  DOMTest::findTestNodes(pDVar28,pDVar1);
  bVar3 = DOMTest::testAttr(pDVar28,document);
  bVar4 = DOMTest::testCDATASection(pDVar28,document);
  bVar5 = DOMTest::testCharacterData(pDVar28,document);
  bVar6 = DOMTest::testChildNodeList(pDVar28,document);
  bVar7 = DOMTest::testComment(pDVar28,document);
  bVar8 = DOMTest::testDeepNodeList(pDVar28,document);
  pDVar28 = &local_41;
  this_00 = pDVar28;
  bVar9 = DOMTest::testDocument(pDVar28,document);
  bVar10 = DOMTest::testDocumentFragment(this_00,document);
  bVar11 = DOMTest::testDocumentType(this_00,document);
  bVar12 = DOMTest::testDOMImplementation(this_00,document);
  bVar13 = DOMTest::testElement(this_00,document);
  bVar14 = DOMTest::testEntityReference(this_00,document);
  bVar15 = DOMTest::testNode(pDVar28,document);
  bVar16 = DOMTest::testNotation(pDVar28,document);
  bVar17 = DOMTest::testPI(pDVar28,document);
  bVar18 = DOMTest::testText(pDVar28,document);
  bVar19 = DOMTest::testDOMerrors(pDVar28,document);
  bVar20 = DOMTest::testXPath(pDVar28,document);
  bVar21 = DOMTest::testRegex(pDVar28);
  DOMTest::testElementNode = (DOMElement *)0x0;
  DOMTest::testAttributeNode = (DOMAttr *)0x0;
  DOMTest::testTextNode = (DOMText *)0x0;
  DOMTest::testCDATASectionNode = (DOMCDATASection *)0x0;
  DOMTest::testEntityReferenceNode = (DOMEntityReference *)0x0;
  DOMTest::testEntityNode = (DOMEntity *)0x0;
  DOMTest::testProcessingInstructionNode = (DOMProcessingInstruction *)0x0;
  DOMTest::testCommentNode = (DOMComment *)0x0;
  DOMTest::testDocumentNode = (DOMDocument *)0x0;
  DOMTest::testDocumentTypeNode = (DOMDocumentType *)0x0;
  DOMTest::testDocumentFragmentNode = (DOMDocumentFragment *)0x0;
  DOMTest::testNotationNode = (DOMNotation *)0x0;
  plVar23 = (long *)(**(code **)(*(long *)document + 0x18))(document,tempStr3);
  (**(code **)(*plVar23 + 0x160))(plVar23,tempStr3,tempStr3);
  (**(code **)(*plVar23 + 0x138))(plVar23);
  plVar23 = (long *)(**(code **)(*(long *)document + 0x18))(document,tempStr3);
  plVar24 = (long *)(**(code **)(*(long *)document + 0x48))(document,tempStr3);
  (**(code **)(*plVar24 + 0x158))(plVar24,tempStr3);
  (**(code **)(*plVar23 + 0x168))(plVar23,plVar24);
  (**(code **)(*plVar23 + 0x1d0))(plVar23,plVar24,1);
  lVar25 = (**(code **)(*(long *)document + 0x98))(document,tempStr3);
  if (lVar25 == 0) {
    main_cold_1();
    bVar2 = false;
  }
  else {
    bVar2 = (((bVar18 && bVar19) && bVar20) && bVar21) &&
            (((((bVar13 && bVar14) && bVar15) && bVar16) && bVar17) &&
            ((((bVar9 && bVar10) && bVar11) && bVar12) &&
            (((bVar6 && bVar7) && bVar8) && ((bVar4 && bVar5) && (bVar2 && bVar3)))));
  }
  (**(code **)(*plVar23 + 0x138))(plVar23);
  lVar25 = (**(code **)(*(long *)document + 0x98))(document,tempStr3);
  if (lVar25 != 0) {
    main_cold_2();
    bVar2 = false;
  }
  pDVar1 = local_40;
  pXVar27 = tempStr;
  (**(code **)(*(long *)local_40 + 0xe8))(local_40);
  (**(code **)(*(long *)pDVar1 + 0x138))(pDVar1);
  this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pXVar27);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  iVar26 = 0;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this);
  bVar5 = SUB81(this,0);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar5);
  pXVar29 = this;
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar5);
  this[0x28] = (XercesDOMParser)0x1;
  bVar3 = DOMTest::testBaseURI((DOMTest *)pXVar29,this);
  this[0x28] = (XercesDOMParser)0x0;
  bVar4 = DOMTest::testBaseURI((DOMTest *)pXVar29,this);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar5);
  pXVar29 = this;
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar5);
  bVar5 = DOMTest::testBaseURI((DOMTest *)pXVar29,this);
  this[0x28] = (XercesDOMParser)0x1;
  bVar6 = DOMTest::testBaseURI((DOMTest *)pXVar29,this);
  bVar7 = DOMTest::testWholeText((DOMTest *)pXVar29,this);
  bVar8 = DOMTest::testScanner((DOMTest *)pXVar29,this);
  (**(code **)(*(long *)this + 8))();
  bVar9 = DOMTest::testLSExceptions((DOMTest *)this);
  bVar10 = DOMTest::testElementTraversal((DOMTest *)this);
  bVar11 = DOMTest::testUtilFunctions((DOMTest *)this);
  xercesc_4_0::XMLPlatformUtils::Terminate();
  if (((bVar10 && bVar9) & bVar2 & (bVar8 && (bVar7 && (bVar6 && (bVar5 && (bVar4 && bVar3))))) &
      bVar11) == 0) {
    puts("Test Failed");
    iVar26 = 4;
  }
  else {
    puts("Test Run Successfully");
  }
  return iVar26;
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
 {
     bool OK = true;

     {
         //  Nest entire test in an inner block.
         //     Reference counting should recover all document
         //     storage when this block exits.

         DOMTest test;
         try {
             XMLPlatformUtils::Initialize();
         }
         catch (const XMLException& toCatch) {
             char *pMessage = XMLString::transcode(toCatch.getMessage());
             fprintf(stderr, "Error during initialization! \n  %s \n", pMessage);
             XMLString::release(&pMessage);
             return -1;
         }

         // for (int i=0; i< 1000; i++)
         // {
         // AH Revisit  //  startTime = System.currentTimeMillis();
         //     if(!OK)
         //     break;

         DOMDocument* d = test.createDocument();

         XMLString::transcode("testDocument1", tempStr, 3999);
         DOMDocumentType* docDocType = test.createDocumentType(d,tempStr);
         d->appendChild(docDocType);

         XMLString::transcode("ourEntityNode", tempStr, 3999);
         DOMEntity* docEntity = test.createEntity( d, tempStr);
         UNUSED(docEntity); // silence warning
         //Build a branch for entityReference tests
         // DOMText* entityChildText = d.createTextNode("entityChildText information"); //
         // docEntity->appendChild(entityChildText);
         // docDocType->getEntities()->setNamedItem(docEntity);

         XMLString::transcode("d", tempStr3, 3999);
         OK &= test.docBuilder(d, tempStr3);

         test.findTestNodes((DOMNode*)d);

         OK &= test.testAttr(d);
         OK &= test.testCDATASection(d);
         OK &= test.testCharacterData(d);
         OK &= test.testChildNodeList(d);
         OK &= test.testComment(d);
         OK &= test.testDeepNodeList(d);
         OK &= test.testDocument(d);
         OK &= test.testDocumentFragment(d);
         OK &= test.testDocumentType(d);
         OK &= test.testDOMImplementation(d);
         OK &= test.testElement(d);
//         OK &= test.testEntity(d);  // Can not test entities;  only parser can create them.
         OK &= test.testEntityReference(d);
         OK &= test.testNode(d);
         OK &= test.testNotation(d);
         OK &= test.testPI(d);
         OK &= test.testText(d);
         OK &= test.testDOMerrors(d);
         OK &= test.testXPath(d);
         OK &= test.testRegex();

         // Null out the static object references in class DOMTest,
         // which will recover their storage.
         DOMTest::testElementNode = 0;
         DOMTest::testAttributeNode = 0;
         DOMTest::testTextNode = 0;
         DOMTest::testCDATASectionNode = 0;
         DOMTest::testEntityReferenceNode = 0;
         DOMTest::testEntityNode = 0;
         DOMTest::testProcessingInstructionNode = 0;
         DOMTest::testCommentNode = 0;
         DOMTest::testDocumentNode = 0;
         DOMTest::testDocumentTypeNode = 0;
         DOMTest::testDocumentFragmentNode = 0;
         DOMTest::testNotationNode = 0;

        // test release of attributes
        DOMElement* elt = d->createElement(tempStr3);
        elt->setAttribute(tempStr3, tempStr3);
        elt->release();
        
        elt = d->createElement(tempStr3);
        DOMAttr *attr = d->createAttribute(tempStr3);
        attr->setValue(tempStr3);
        elt->setAttributeNode(attr);
        elt->setIdAttributeNode(attr, true);

        DOMElement *eleTest = d->getElementById(tempStr3);
        if(eleTest==NULL)
        {
            fprintf(stderr, "getElementById test failed at line %i\n", __LINE__);
            OK = false;
        }

        //all good until here
        elt->release();
        eleTest = d->getElementById(tempStr3);
        if(eleTest!=NULL)
        {
            fprintf(stderr, "getElementById test failed at line %i\n", __LINE__);
            OK = false;
        }

        // we couldn't really test the user data handler call as the userhandler is already
        // deleted when the release() is done, but still set it to test the code internally
        d->setUserData(tempStr, (void*) tempStr, &userhandler);
        d->release();

        // Test baseURI. BaseURI is set on nodes at parse time so we
        // cannot use the docBuilder document above

        //Setup parser

        XercesDOMParser *parser = new XercesDOMParser;
        parser->setValidationScheme(XercesDOMParser::Val_Never);
        parser->setDoNamespaces(true);
        parser->setDoSchema(true);
        parser->setCreateEntityReferenceNodes(true);

        OK &= test.testBaseURI(parser);

        parser->setCreateEntityReferenceNodes(false);
        OK &= test.testBaseURI(parser);

        parser->setDoNamespaces(false);
        parser->setDoSchema(false);
        OK &= test.testBaseURI(parser);

        parser->setCreateEntityReferenceNodes(true);
        OK &= test.testBaseURI(parser);

		OK &= test.testWholeText(parser);
        OK &= test.testScanner(parser);
        delete parser;

        OK &= test.testLSExceptions();

        OK &= test.testElementTraversal();

        OK &= test.testUtilFunctions();
    }

    XMLPlatformUtils::Terminate();

    if (!OK) {
        printf("Test Failed\n");
        return 4;
    }

    printf("Test Run Successfully\n");

    return 0;
}